

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis.c
# Opt level: O0

char * snvis(char *mbdst,size_t dlen,wchar_t c,wchar_t flags,wchar_t nextc,char *mbextra)

{
  wchar_t wVar1;
  char local_3a;
  undefined1 local_39;
  wchar_t ret;
  char cc [2];
  char *mbextra_local;
  wchar_t nextc_local;
  wchar_t flags_local;
  wchar_t c_local;
  size_t dlen_local;
  char *mbdst_local;
  
  local_3a = (char)c;
  local_39 = (undefined1)nextc;
  _ret = mbextra;
  _flags_local = dlen;
  dlen_local = (size_t)mbdst;
  wVar1 = istrsenvisx((char **)&dlen_local,(size_t *)&flags_local,&local_3a,1,flags,mbextra,
                      (wchar_t *)0x0);
  if (wVar1 < L'\0') {
    mbdst_local = (char *)0x0;
  }
  else {
    mbdst_local = (char *)(dlen_local + (long)wVar1);
  }
  return mbdst_local;
}

Assistant:

char *
snvis(char *mbdst, size_t dlen, int c, int flags, int nextc, const char *mbextra)
{
	char cc[2];
	int ret;

	cc[0] = c;
	cc[1] = nextc;

	ret = istrsenvisx(&mbdst, &dlen, cc, 1, flags, mbextra, NULL);
	if (ret < 0)
		return NULL;
	return mbdst + ret;
}